

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbufstream.h
# Opt level: O0

ktx_error_code_e
StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos
          (ktxStream *str,ktx_off_t *offset)

{
  streamoff sVar1;
  ostream *this;
  void *this_00;
  long *in_RSI;
  ktxStream *in_RDI;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *self;
  fpos local_28 [16];
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = parent(in_RDI);
  local_28 = (fpos  [16])std::streambuf::pubseekoff((long)local_18->_streambuf,_S_beg,_S_app);
  sVar1 = std::fpos::operator_cast_to_long(local_28);
  *local_10 = sVar1;
  this = std::operator<<((ostream *)cnull,"\tgetpos: ");
  this_00 = (void *)std::ostream::operator<<(this,*local_10);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code getpos(ktxStream* str, ktx_off_t *offset)
    {
        auto self = parent(str);
        *offset = ktx_off_t(self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode));
        logstream << "\tgetpos: " << *offset << std::endl;
        return KTX_SUCCESS;
    }